

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.c
# Opt level: O3

int lreplace(RSIZE plen,char *st)

{
  ushort uVar1;
  ushort *puVar2;
  __int32_t *p_Var3;
  long lVar4;
  int iVar5;
  byte *__s;
  size_t sVar6;
  ushort **ppuVar7;
  __int32_t **pp_Var8;
  ushort uVar9;
  char *pcVar10;
  line *plVar11;
  uint len;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  
  iVar5 = checkdirty(curbp);
  if (iVar5 != 1) {
    return iVar5;
  }
  if ((curbp->b_flag & 0x10U) != 0) {
    dobeep();
    pcVar10 = "Buffer is read only";
LAB_0011395c:
    ewprintf(pcVar10);
    return 0;
  }
  __s = (byte *)strdup(st);
  if (__s == (byte *)0x0) {
    dobeep();
    pcVar10 = "out of memory";
    goto LAB_0011395c;
  }
  sVar6 = strlen((char *)__s);
  undo_boundary_enable(8,0);
  backchar(0xf,plen);
  len = (uint)sVar6;
  if (casereplace != 1) goto LAB_001139be;
  plVar11 = curwp->w_dotp;
  pcVar10 = plVar11->l_text;
  if (pcVar10 == (char *)0x0) goto LAB_001139be;
  uVar13 = (ulong)curwp->w_doto;
  ppuVar7 = __ctype_b_loc();
  puVar2 = *ppuVar7;
  uVar1 = puVar2[(byte)pcVar10[uVar13]];
  bVar14 = true;
  if ((uVar1 >> 8 & 1) == 0) {
LAB_001138f1:
    if (0 < (int)len) goto LAB_001138fa;
    if (((byte)(uVar1 >> 8) & bVar14) == 0) goto LAB_001139be;
  }
  else {
    if (0 < plen) {
      iVar5 = 0;
      do {
        uVar9 = 1;
        if ((puVar2[(byte)plVar11->l_text[(int)uVar13]] >> 10 & 1) != 0) {
          uVar9 = puVar2[(byte)plVar11->l_text[(int)uVar13]] >> 8 & 1;
        }
        uVar12 = (int)uVar13 + 1;
        uVar13 = (ulong)uVar12;
        if (uVar12 == plVar11->l_used) {
          plVar11 = plVar11->l_fp;
          iVar5 = iVar5 + 1;
          uVar13 = 0;
        }
      } while ((uVar9 != 0) && (iVar5 = iVar5 + 1, iVar5 < plen));
      bVar14 = uVar9 == 0;
      goto LAB_001138f1;
    }
    if ((int)len < 1) goto LAB_001139be;
    bVar14 = false;
LAB_001138fa:
    uVar13 = 1;
    do {
      lVar4 = uVar13 - 1;
      if ((len & 0x7fffffff) <= uVar13) break;
      uVar13 = uVar13 + 1;
    } while ((puVar2[__s[lVar4]] & 0x100) == 0);
    if ((puVar2[__s[lVar4]] >> 8 & 1) != 0) goto LAB_001139be;
    if (!bVar14) {
      pp_Var8 = __ctype_toupper_loc();
      p_Var3 = *pp_Var8;
      uVar13 = 0;
      do {
        __s[uVar13] = *(byte *)(p_Var3 + __s[uVar13]);
        uVar13 = uVar13 + 1;
      } while ((len & 0x7fffffff) != uVar13);
      goto LAB_001139be;
    }
    if ((uVar1 >> 8 & 1) == 0) goto LAB_001139be;
  }
  pp_Var8 = __ctype_toupper_loc();
  *__s = *(byte *)(*pp_Var8 + *__s);
LAB_001139be:
  ldelete(plen,0);
  region_put_data((char *)__s,len);
  lchange(8);
  undo_boundary_enable(8,1);
  free(__s);
  return 1;
}

Assistant:

int
lreplace(RSIZE plen, char *st)
{
	RSIZE	rlen;	/* replacement length		 */
	struct line *lp;
	RSIZE n;
	int s, doto, is_query_capitalised = 0, is_query_allcaps = 0;
	int is_replace_alllower = 0;
	char *repl = NULL;

	if ((s = checkdirty(curbp)) != TRUE)
		return (s);
	if (curbp->b_flag & BFREADONLY) {
		dobeep();
		ewprintf("Buffer is read only");
		return (FALSE);
	}

	if ((repl = strdup(st)) == NULL) {
		dobeep();
		ewprintf("out of memory");
		return (FALSE);
	}
	rlen = strlen(repl);

	undo_boundary_enable(FFRAND, 0);
	(void)backchar(FFARG | FFRAND, (int)plen);

	if (casereplace != TRUE)
		goto done;

	lp = curwp->w_dotp;
	if (ltext(lp) == NULL)
		goto done;
	doto = curwp->w_doto;
	n = plen;

	is_query_capitalised = isupper((unsigned char)lgetc(lp, doto));

	if (is_query_capitalised) {
		for (n = 0, is_query_allcaps = 1; n < plen && is_query_allcaps;
		    n++) {
			is_query_allcaps = !isalpha((unsigned char)lgetc(lp,
			    doto)) || isupper((unsigned char)lgetc(lp, doto));
			doto++;
			if (doto == llength(lp)) {
				doto = 0;
				lp = lforw(lp);
				n++; /* \n is implicit in the buffer */
			}
		}
	}

	for (n = 0, is_replace_alllower = 1; n < rlen && is_replace_alllower;
	    n++)
		is_replace_alllower = !isupper((unsigned char)repl[n]);

	if (is_replace_alllower) {
		if (is_query_allcaps) {
			for (n = 0; n < rlen; n++)
				repl[n] = toupper((unsigned char)repl[n]);
		} else if (is_query_capitalised) {
			repl[0] = toupper((unsigned char)repl[0]);
		}
	}

 done:
	(void)ldelete(plen, KNONE);
	region_put_data(repl, rlen);
	lchange(WFFULL);

	undo_boundary_enable(FFRAND, 1);

	free(repl);
	return (TRUE);
}